

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::rescalePartials
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,double *scaleFactors,
          double *cumulativeScaleFactors,int fillWithOnes)

{
  double *pdVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  
  if (0 < (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount) {
    lVar2 = (this->super_BeagleCPUImpl<double,_1,_0>).kFlags;
    lVar7 = 0;
    iVar9 = 0;
    do {
      dVar10 = 1.0;
      iVar5 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
      if (0 < iVar5) {
        auVar11 = ZEXT816(0);
        iVar6 = iVar5;
        iVar8 = iVar9;
        do {
          auVar13._8_8_ = 0;
          auVar13._0_8_ = destP[iVar8];
          auVar14._8_8_ = 0;
          auVar14._0_8_ = destP[(long)iVar8 + 1];
          auVar17._8_8_ = 0;
          auVar17._0_8_ = destP[(long)iVar8 + 2];
          auVar11 = vmaxsd_avx(auVar13,auVar11);
          auVar11 = vmaxsd_avx(auVar14,auVar11);
          auVar15._8_8_ = 0;
          auVar15._0_8_ = destP[(long)iVar8 + 3];
          iVar8 = iVar8 + (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount * 4;
          iVar6 = iVar6 + -1;
          auVar11 = vmaxsd_avx(auVar17,auVar11);
          auVar11 = vmaxsd_avx(auVar15,auVar11);
        } while (iVar6 != 0);
        uVar3 = vcmpsd_avx512f(auVar11,ZEXT816(0),0);
        bVar4 = (bool)((byte)uVar3 & 1);
        dVar10 = (double)((ulong)bVar4 * 0x3ff0000000000000 + (ulong)!bVar4 * auVar11._0_8_);
        if (0 < iVar5) {
          iVar6 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
          dVar12 = 1.0 / dVar10;
          iVar8 = iVar9;
          do {
            pdVar1 = destP + iVar8;
            auVar16._0_8_ = dVar12 * *pdVar1;
            auVar16._8_8_ = dVar12 * pdVar1[1];
            auVar16._16_8_ = dVar12 * pdVar1[2];
            auVar16._24_8_ = dVar12 * pdVar1[3];
            *(undefined1 (*) [32])(destP + iVar8) = auVar16;
            iVar8 = iVar8 + iVar6 * 4;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
      }
      if (((uint)lVar2 >> 10 & 1) == 0) {
        scaleFactors[lVar7] = dVar10;
        if (cumulativeScaleFactors != (double *)0x0) {
          dVar10 = log(dVar10);
LAB_00129138:
          cumulativeScaleFactors[lVar7] = dVar10 + cumulativeScaleFactors[lVar7];
        }
      }
      else {
        dVar10 = log(dVar10);
        scaleFactors[lVar7] = dVar10;
        if (cumulativeScaleFactors != (double *)0x0) goto LAB_00129138;
      }
      lVar7 = lVar7 + 1;
      iVar9 = iVar9 + 4;
    } while (lVar7 < (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::rescalePartials(REALTYPE* destP,
		REALTYPE* scaleFactors,
		REALTYPE* cumulativeScaleFactors,
        const int  fillWithOnes) {

	bool useLogScalars = kFlags & BEAGLE_FLAG_SCALERS_LOG;

    for (int k = 0; k < kPatternCount; k++) {
    	REALTYPE max = 0;
        const int patternOffset = k * 4;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;

#ifdef BEAGLE_TEST_OPTIMIZATION
            REALTYPE max01 = FAST_MAX(destP[offset + 0], destP[offset + 1]);
            REALTYPE max23 = FAST_MAX(destP[offset + 2], destP[offset + 3]);
            max = FAST_MAX(max, max01);
            max = FAST_MAX(max, max23);
#else
			#pragma unroll
            for (int i = 0; i < 4; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
#endif
        }

        if (max == 0)
            max = REALTYPE(1.0);

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;
			#pragma unroll
            for (int i = 0; i < 4; i++)
                destP[offset++] *= oneOverMax;
        }

        if (useLogScalars) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}